

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_LU_invmult(m256v *LU,int rank,int *rowperm,int *colperm,m256v *Y,m256v *X_out)

{
  long in_RCX;
  int in_ESI;
  int *in_RDI;
  int *in_R9;
  int j_1;
  int i_2;
  int j;
  int i_1;
  int i;
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_c;
  
  local_c = in_ESI;
  if (in_ESI == -1) {
    if (in_RDI[1] < *in_RDI) {
      local_48 = in_RDI[1];
    }
    else {
      local_48 = *in_RDI;
    }
    local_c = local_48;
  }
  for (local_34 = local_c; local_34 < *in_R9; local_34 = local_34 + 1) {
    m256v_clear_row((m256v *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  }
  for (local_38 = 0; local_44 = local_c, local_38 < local_c; local_38 = local_38 + 1) {
    m256v_copy_row((m256v *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (m256v *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    for (local_3c = 0; local_3c < local_38; local_3c = local_3c + 1) {
      in_stack_ffffffffffffffb4 = *(undefined4 *)(in_RCX + (long)local_3c * 4);
      in_stack_ffffffffffffffa8 = in_R9;
      m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
      m256v_multadd_row((m256v *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                        (uint8_t)((ulong)in_stack_ffffffffffffff98 >> 0x18),
                        (m256v *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    }
  }
  while (local_40 = local_44 + -1, -1 < local_40) {
    for (; local_44 < in_RDI[1]; local_44 = local_44 + 1) {
      in_stack_ffffffffffffffa4 = *(undefined4 *)(in_RCX + (long)local_44 * 4);
      in_stack_ffffffffffffff98 = in_R9;
      m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
      m256v_multadd_row((m256v *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                        (uint8_t)((ulong)in_stack_ffffffffffffff98 >> 0x18),
                        (m256v *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    }
    in_stack_ffffffffffffff94 = *(undefined4 *)(in_RCX + (long)local_40 * 4);
    in_stack_ffffffffffffff88 = in_R9;
    m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (int)((ulong)in_R9 >> 0x20),(int)in_R9);
    gf256_inv('\0');
    m256v_mult_row((m256v *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (uint8_t)((ulong)in_stack_ffffffffffffff98 >> 0x18));
    local_44 = local_40;
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_invmult)(const MV_GEN_TYPE* LU,
			int rank,
			const int* rowperm,
			const int* colperm,
			const MV_GEN_TYPE* Y,
			MV_GEN_TYPE* X_out)
{
	/* Check dimensions */
	assert(LU->n_col == X_out->n_row);
	assert(LU->n_row == Y->n_row);
	assert(X_out->n_col == Y->n_col);

	/* If the rank is unspecified (-1), we assume the max rank */
	if (rank == -1)
		rank = (LU->n_col < LU->n_row ? LU->n_col : LU->n_row);

	/* Clear out the unused rows in the target vector */
	for (int i = rank; i < X_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(X_out, colperm[i]);
	}

	/* Multiply with L^-1 */
	for (int i = 0; i < rank; ++i) {
		MV_GEN_N(_copy_row)(Y, rowperm[i], X_out, colperm[i]);
		for (int j = 0; j < i; ++j) {
			MV_GEN_N(_multadd_row)(X_out, colperm[j],
					MV_GEN_N(_get_el)(LU, i, j),
					X_out, colperm[i]);
		}
	}

	/* Multiply with U^-1 */
	for (int i = rank - 1; i >= 0; --i) {
		for (int j = i + 1; j < LU->n_col; ++j) {
			MV_GEN_N(_multadd_row)(X_out, colperm[j],
			  MV_GEN_N(_get_el)(LU, i, j), X_out, colperm[i]);
		}
		MV_GEN_N(_mult_row)(X_out, colperm[i],
				finv(MV_GEN_N(_get_el)(LU, i, i)));
	}
}